

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O1

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_first_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> *v,size_type pos)

{
  char *pcVar1;
  const_pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  char *pcVar5;
  char *pcVar6;
  char *in_R9;
  size_type sVar7;
  char *pcVar8;
  bool bVar9;
  
  sVar4 = 0xffffffffffffffff;
  if (pos < this->size_) {
    pcVar2 = this->data_;
    pcVar5 = pcVar2 + this->size_;
    sVar3 = v->size_;
    pcVar6 = pcVar2 + pos;
    do {
      pcVar8 = in_R9;
      bVar9 = sVar3 == 0;
      if ((sVar3 != 0) && (pcVar8 = pcVar6, *pcVar6 != *v->data_)) {
        sVar7 = 1;
        do {
          bVar9 = sVar3 == sVar7;
          pcVar8 = in_R9;
          if (bVar9) break;
          pcVar1 = v->data_ + sVar7;
          pcVar8 = pcVar6;
          sVar7 = sVar7 + 1;
        } while (*pcVar6 != *pcVar1);
      }
      in_R9 = pcVar8;
      pcVar8 = in_R9;
    } while ((bVar9) && (pcVar6 = pcVar6 + 1, pcVar8 = pcVar5, pcVar6 != pcVar5));
    sVar4 = 0xffffffffffffffff;
    if (pcVar5 != pcVar8) {
      sVar4 = (long)pcVar8 - (long)pcVar2;
    }
  }
  return sVar4;
}

Assistant:

nssv_constexpr size_type size()     const nssv_noexcept { return size_; }